

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zher2.c
# Opt level: O2

int zher2_(char *uplo,integer *n,doublecomplex *alpha,doublecomplex *x,integer *incx,
          doublecomplex *y,integer *incy,doublecomplex *a,integer *lda)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  char cVar4;
  uint uVar5;
  double dVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  double *pdVar11;
  doublecomplex *pdVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  double *pdVar20;
  double dVar21;
  double dVar22;
  integer info;
  doublecomplex local_d8;
  doublecomplex *local_c8;
  doublecomplex *local_c0;
  doublecomplex local_b8;
  ulong local_a0;
  int *local_98;
  doublecomplex *local_90;
  doublecomplex *local_88;
  double dStack_80;
  doublecomplex *local_70;
  double local_68;
  double dStack_60;
  doublecomplex *local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  
  info = 0;
  cVar4 = *uplo;
  if ((cVar4 != 'L') && (cVar4 != 'U')) {
    info = 1;
LAB_0011f45f:
    input_error("ZHER2 ",&info);
    return 0;
  }
  iVar9 = *n;
  if (iVar9 < 0) {
    info = 2;
    goto LAB_0011f45f;
  }
  iVar13 = *incx;
  if (iVar13 == 0) {
    info = 5;
    goto LAB_0011f45f;
  }
  iVar18 = *incy;
  if (iVar18 == 0) {
    info = 7;
    goto LAB_0011f45f;
  }
  uVar8 = (ulong)(uint)*lda;
  if (*lda < (int)(iVar9 + (uint)(iVar9 == 0))) {
    info = 9;
    goto LAB_0011f45f;
  }
  if (iVar9 == 0) {
    return 0;
  }
  if ((((alpha->r == 0.0) && (!NAN(alpha->r))) && (alpha->i == 0.0)) && (!NAN(alpha->i))) {
    return 0;
  }
  uVar15 = 1;
  local_98 = n;
  local_90 = alpha;
  if (iVar13 == 1) {
    if (iVar18 == 1) {
      if (cVar4 == 'U') goto LAB_0011f52a;
      goto LAB_0011f7ad;
    }
    iVar16 = 1;
  }
  else {
    iVar16 = 1 - iVar13 * (iVar9 + -1);
    if (0 < iVar13) {
      iVar16 = 1;
    }
  }
  local_c0 = (doublecomplex *)CONCAT44(local_c0._4_4_,iVar16);
  iVar19 = 1 - (iVar9 + -1) * iVar18;
  if (0 < iVar18) {
    iVar19 = 1;
  }
  local_a0 = CONCAT44(local_a0._4_4_,iVar19);
  if (cVar4 == 'U') {
    if (iVar18 != 1 || iVar13 != 1) {
      iVar10 = 0;
      while ((int)uVar15 <= iVar9) {
        local_88 = x + iVar16;
        local_c8 = (doublecomplex *)uVar15;
        if (((((x[(long)iVar16 + -1].r != 0.0) || (NAN(x[(long)iVar16 + -1].r))) ||
             ((local_88[-1].i != 0.0 || ((NAN(local_88[-1].i) || (y[(long)iVar19 + -1].r != 0.0)))))
             ) || (NAN(y[(long)iVar19 + -1].r))) ||
           ((y[(long)iVar19 + -1].i != 0.0 || (NAN(y[(long)iVar19 + -1].i))))) {
          local_70 = (doublecomplex *)CONCAT44(local_70._4_4_,iVar19);
          local_68 = (double)CONCAT44(local_68._4_4_,iVar16);
          local_58 = y + iVar19;
          d_cnjg(&local_d8,y + (long)iVar19 + -1);
          dVar21 = alpha->r;
          dVar3 = alpha->i;
          local_b8.r = local_d8.r * dVar21 + local_d8.i * -dVar3;
          local_b8.i = local_d8.i * dVar21 + local_d8.r * dVar3;
          local_d8.r = dVar21 * local_88[-1].r + -dVar3 * local_88[-1].i;
          local_d8.i = dVar21 * local_88[-1].i + dVar3 * local_88[-1].r;
          local_48 = local_b8.r;
          dStack_40 = local_b8.i;
          d_cnjg(&local_b8,&local_d8);
          iVar9 = (int)local_c0;
          iVar13 = (int)local_a0;
          for (lVar14 = 0; iVar10 != (int)lVar14; lVar14 = lVar14 + 1) {
            dVar21 = x[(long)iVar9 + -1].r;
            dVar3 = x[(long)iVar9 + -1].i;
            lVar7 = (long)*lda * (long)iVar10 + lVar14;
            dVar22 = y[(long)iVar13 + -1].r;
            dVar2 = y[(long)iVar13 + -1].i;
            a[lVar7].r = dVar22 * local_b8.r + local_b8.i * -dVar2 +
                         a[lVar7].r + dVar21 * local_48 + dStack_40 * -dVar3;
            a[lVar7].i = dVar22 * local_b8.i + local_b8.r * dVar2 +
                         a[lVar7].i + dVar21 * dStack_40 + local_48 * dVar3;
            iVar9 = iVar9 + *incx;
            iVar13 = iVar13 + *incy;
          }
          local_d8.r = local_88[-1].r * local_48 + dStack_40 * -local_88[-1].i;
          local_d8.i = local_88[-1].r * dStack_40 + local_48 * local_88[-1].i;
          dVar21 = local_b8.r * local_58[-1].i;
          local_b8.r = local_58[-1].r * local_b8.r + local_b8.i * -local_58[-1].i + local_d8.r;
          local_b8.i = local_58[-1].r * local_b8.i + dVar21 + local_d8.i;
          uVar8 = (ulong)(uint)*lda;
          iVar9 = (*lda + 1U) * ((int)local_c8 + -1);
          a[iVar9].r = local_b8.r + a[iVar9].r;
          a[iVar9].i = 0.0;
          iVar13 = *incx;
          iVar18 = *incy;
          iVar9 = *local_98;
          alpha = local_90;
          iVar16 = local_68._0_4_;
          iVar19 = (int)local_70;
        }
        else {
          a[((int)uVar8 + 1) * ((int)uVar15 + -1)].i = 0.0;
        }
        iVar16 = iVar16 + iVar13;
        iVar19 = iVar19 + iVar18;
        iVar10 = iVar10 + 1;
        uVar15 = (ulong)((int)local_c8 + 1);
      }
      return 0;
    }
LAB_0011f52a:
    lVar14 = 0;
    for (local_c0 = (doublecomplex *)0x1; (long)local_c0 <= (long)iVar9;
        local_c0 = (doublecomplex *)((long)local_c0 + 1)) {
      local_a0 = (long)local_c0 + -1;
      pdVar12 = x + local_a0;
      if ((((x[local_a0].r != 0.0) || (NAN(x[local_a0].r))) || (pdVar12->i != 0.0)) ||
         (((NAN(pdVar12->i) || (y[local_a0].r != 0.0)) ||
          ((NAN(y[local_a0].r) || ((y[local_a0].i != 0.0 || (NAN(y[local_a0].i))))))))) {
        local_c8 = y + local_a0;
        d_cnjg(&local_d8,local_c8);
        dVar21 = alpha->r;
        dVar3 = alpha->i;
        local_b8.r = local_d8.r * dVar21 + local_d8.i * -dVar3;
        local_b8.i = local_d8.i * dVar21 + local_d8.r * dVar3;
        local_d8.r = dVar21 * pdVar12->r + -dVar3 * pdVar12->i;
        local_d8.i = dVar21 * pdVar12->i + dVar3 * pdVar12->r;
        local_88 = (doublecomplex *)local_b8.r;
        dStack_80 = local_b8.i;
        d_cnjg(&local_b8,&local_d8);
        for (lVar7 = 0; lVar14 != lVar7; lVar7 = lVar7 + 0x10) {
          dVar21 = *(double *)((long)&x->r + lVar7);
          dVar3 = *(double *)((long)&x->i + lVar7);
          pdVar11 = (double *)((long)&a->r + lVar7 + *lda * lVar14);
          dVar6 = pdVar11[1];
          dVar22 = *(double *)((long)&y->r + lVar7);
          dVar2 = *(double *)((long)&y->i + lVar7);
          pdVar20 = (double *)((long)&a->r + lVar7 + *lda * lVar14);
          *pdVar20 = dVar22 * local_b8.r + local_b8.i * -dVar2 +
                     *pdVar11 + dVar21 * (double)local_88 + dStack_80 * -dVar3;
          pdVar20[1] = dVar22 * local_b8.i + local_b8.r * dVar2 +
                       dVar6 + dVar21 * dStack_80 + (double)local_88 * dVar3;
        }
        local_d8.r = pdVar12->r * (double)local_88 + dStack_80 * -pdVar12->i;
        local_d8.i = pdVar12->r * dStack_80 + (double)local_88 * pdVar12->i;
        dVar21 = local_b8.r * local_c8->i;
        local_b8.r = local_c8->r * local_b8.r + local_b8.i * -local_c8->i + local_d8.r;
        local_b8.i = local_c8->r * local_b8.i + dVar21 + local_d8.i;
        uVar8 = (ulong)(uint)*lda;
        iVar9 = (int)local_a0 * (*lda + 1U);
        a[iVar9].r = local_b8.r + a[iVar9].r;
        a[iVar9].i = 0.0;
        iVar9 = *local_98;
        alpha = local_90;
      }
      else {
        a[(int)local_a0 * ((int)uVar8 + 1)].i = 0.0;
      }
      lVar14 = lVar14 + 0x10;
    }
    return 0;
  }
  if (iVar18 != 1 || iVar13 != 1) {
    local_68 = 4.94065645841247e-324;
    local_c8 = (doublecomplex *)((ulong)local_c8 & 0xffffffff00000000);
    local_88 = a;
    while( true ) {
      local_88 = local_88 + 1;
      if (iVar9 < SUB84(local_68,0)) break;
      lVar14 = (long)(int)local_c0;
      lVar7 = (long)(int)local_a0;
      if ((((x[lVar14 + -1].r != 0.0) || (NAN(x[lVar14 + -1].r))) || (x[lVar14 + -1].i != 0.0)) ||
         (((NAN(x[lVar14 + -1].i) || (y[lVar7 + -1].r != 0.0)) ||
          ((NAN(y[lVar7 + -1].r) || ((y[lVar7 + -1].i != 0.0 || (NAN(y[lVar7 + -1].i))))))))) {
        local_70 = y + lVar7 + -1;
        d_cnjg(&local_d8,local_70);
        dVar21 = alpha->r;
        dVar3 = alpha->i;
        local_b8.r = local_d8.r * dVar21 + local_d8.i * -dVar3;
        local_b8.i = local_d8.i * dVar21 + local_d8.r * dVar3;
        local_d8.r = dVar21 * x[lVar14 + -1].r + -dVar3 * x[lVar14 + -1].i;
        local_d8.i = dVar21 * x[lVar14 + -1].i + dVar3 * x[lVar14 + -1].r;
        local_58 = (doublecomplex *)local_b8.r;
        dStack_50 = local_b8.i;
        d_cnjg(&local_b8,&local_d8);
        dVar3 = local_b8.i;
        dVar21 = local_b8.r;
        dVar22 = local_70->i * local_b8.r;
        local_d8.r = (double)local_58 * x[lVar14 + -1].r + -x[lVar14 + -1].i * dStack_50;
        local_d8.i = dStack_50 * x[lVar14 + -1].r + x[lVar14 + -1].i * (double)local_58;
        local_b8.r = local_b8.r * local_70->r + -local_70->i * local_b8.i + local_d8.r;
        local_b8.i = local_d8.i + local_b8.i * local_70->r + dVar22;
        uVar5 = *lda;
        uVar8 = (ulong)uVar5;
        iVar9 = (uVar5 + 1) * (SUB84(local_68,0) + -1);
        a[iVar9].r = local_b8.r + a[iVar9].r;
        a[iVar9].i = 0.0;
        iVar9 = *local_98;
        pdVar12 = local_88 + (int)(uVar5 * (int)local_c8);
        uVar15 = (ulong)local_c0 & 0xffffffff;
        uVar17 = local_a0 & 0xffffffff;
        for (dVar22 = local_68; (long)dVar22 < (long)iVar9; dVar22 = (double)((long)dVar22 + 1)) {
          uVar15 = (long)(int)uVar15 + (long)*incx;
          uVar17 = (long)(int)uVar17 + (long)*incy;
          local_d8.r = pdVar12->r +
                       x[uVar15 - 1].r * (double)local_58 + dStack_50 * -x[uVar15 - 1].i;
          local_d8.i = pdVar12->i + x[uVar15 - 1].r * dStack_50 + (double)local_58 * x[uVar15 - 1].i
          ;
          local_b8.r = y[uVar17 - 1].r * dVar21 + dVar3 * -y[uVar17 - 1].i + local_d8.r;
          local_b8.i = y[uVar17 - 1].r * dVar3 + dVar21 * y[uVar17 - 1].i + local_d8.i;
          pdVar12->r = local_b8.r;
          pdVar12->i = local_b8.i;
          pdVar12 = pdVar12 + 1;
        }
        iVar13 = *incx;
        iVar18 = *incy;
        alpha = local_90;
      }
      else {
        a[((int)uVar8 + 1) * (SUB84(local_68,0) + -1)].i = 0.0;
      }
      local_c0 = (doublecomplex *)CONCAT44(local_c0._4_4_,(int)local_c0 + iVar13);
      local_a0 = CONCAT44(local_a0._4_4_,(int)local_a0 + iVar18);
      local_68 = (double)((long)local_68 + 1);
      local_c8 = (doublecomplex *)CONCAT44(local_c8._4_4_,(int)local_c8 + 1);
    }
    return 0;
  }
LAB_0011f7ad:
  pdVar11 = &y[1].i;
  pdVar20 = &x[1].i;
  local_c8 = (doublecomplex *)0x0;
  local_c0 = a;
  for (local_a0 = 1; local_c0 = local_c0 + 1, (long)local_a0 <= (long)iVar9; local_a0 = local_a0 + 1
      ) {
    lVar14 = local_a0 + -1;
    pdVar12 = x + lVar14;
    if (((((x[lVar14].r != 0.0) || (NAN(x[lVar14].r))) || (pdVar12->i != 0.0)) ||
        ((NAN(pdVar12->i) || (y[lVar14].r != 0.0)))) ||
       ((NAN(y[lVar14].r) || ((y[lVar14].i != 0.0 || (NAN(y[lVar14].i))))))) {
      local_88 = (doublecomplex *)lVar14;
      d_cnjg(&local_d8,y + lVar14);
      dVar21 = local_90->r;
      dVar3 = local_90->i;
      local_b8.r = local_d8.r * dVar21 + local_d8.i * -dVar3;
      local_b8.i = local_d8.i * dVar21 + local_d8.r * dVar3;
      local_d8.r = dVar21 * pdVar12->r + -dVar3 * pdVar12->i;
      local_d8.i = dVar21 * pdVar12->i + dVar3 * pdVar12->r;
      local_68 = local_b8.r;
      dStack_60 = local_b8.i;
      d_cnjg(&local_b8,&local_d8);
      dVar3 = local_b8.i;
      dVar21 = local_b8.r;
      dVar22 = y[lVar14].i * local_b8.r;
      local_d8.r = local_68 * pdVar12->r + -pdVar12->i * dStack_60;
      local_d8.i = dStack_60 * pdVar12->r + pdVar12->i * local_68;
      local_b8.r = local_b8.r * y[lVar14].r + -y[lVar14].i * local_b8.i + local_d8.r;
      local_b8.i = local_d8.i + local_b8.i * y[lVar14].r + dVar22;
      uVar8 = (ulong)*lda;
      iVar9 = (int)local_88 * (*lda + 1);
      a[iVar9].r = local_b8.r + a[iVar9].r;
      a[iVar9].i = 0.0;
      iVar9 = *local_98;
      lVar14 = 0;
      for (uVar15 = local_a0; (long)uVar15 < (long)iVar9; uVar15 = uVar15 + 1) {
        dVar22 = *(double *)((long)pdVar20 + lVar14 + -8);
        pdVar1 = (double *)((long)&local_c0->r + lVar14 + uVar8 * (long)local_c8);
        local_d8.r = *pdVar1 + dVar22 * local_68 + dStack_60 * -*(double *)((long)pdVar20 + lVar14);
        local_d8.i = pdVar1[1] + dVar22 * dStack_60 + local_68 * *(double *)((long)pdVar20 + lVar14)
        ;
        dVar22 = *(double *)((long)pdVar11 + lVar14 + -8);
        local_b8.r = dVar22 * dVar21 + dVar3 * -*(double *)((long)pdVar11 + lVar14) + local_d8.r;
        local_b8.i = dVar22 * dVar3 + dVar21 * *(double *)((long)pdVar11 + lVar14) + local_d8.i;
        pdVar1 = (double *)((long)&local_c0->r + lVar14 + uVar8 * (long)local_c8);
        *pdVar1 = local_b8.r;
        pdVar1[1] = local_b8.i;
        lVar14 = lVar14 + 0x10;
      }
    }
    else {
      a[(int)lVar14 * ((int)uVar8 + 1)].i = 0.0;
    }
    local_c8 = (doublecomplex *)((long)local_c8 + 0x10);
    pdVar11 = pdVar11 + 2;
    pdVar20 = pdVar20 + 2;
  }
  return 0;
}

Assistant:

int zher2_(char *uplo, integer *n, doublecomplex *alpha, 
	doublecomplex *x, integer *incx, doublecomplex *y, integer *incy, 
	doublecomplex *a, integer *lda)
{


    /* System generated locals */

    doublereal d__1;
    doublecomplex z__1, z__2, z__3, z__4;

    /* Builtin functions */
    void d_cnjg(doublecomplex *, doublecomplex *);

    /* Local variables */
    integer info;
    doublecomplex temp1, temp2;
    integer i, j;
    integer ix, iy, jx, jy, kx, ky;

    extern int input_error(char *, int *);

/*  Purpose   
    =======   

    ZHER2  performs the hermitian rank 2 operation   

       A := alpha*x*conjg( y' ) + conjg( alpha )*y*conjg( x' ) + A,   

    where alpha is a scalar, x and y are n element vectors and A is an n 
  
    by n hermitian matrix.   

    Parameters   
    ==========   

    UPLO   - CHARACTER*1.   
             On entry, UPLO specifies whether the upper or lower   
             triangular part of the array A is to be referenced as   
             follows:   

                UPLO = 'U' or 'u'   Only the upper triangular part of A   
                                    is to be referenced.   

                UPLO = 'L' or 'l'   Only the lower triangular part of A   
                                    is to be referenced.   

             Unchanged on exit.   

    N      - INTEGER.   
             On entry, N specifies the order of the matrix A.   
             N must be at least zero.   
             Unchanged on exit.   

    ALPHA  - COMPLEX*16      .   
             On entry, ALPHA specifies the scalar alpha.   
             Unchanged on exit.   

    X      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCX ) ).   
             Before entry, the incremented array X must contain the n   
             element vector x.   
             Unchanged on exit.   

    INCX   - INTEGER.   
             On entry, INCX specifies the increment for the elements of   
             X. INCX must not be zero.   
             Unchanged on exit.   

    Y      - COMPLEX*16       array of dimension at least   
             ( 1 + ( n - 1 )*abs( INCY ) ).   
             Before entry, the incremented array Y must contain the n   
             element vector y.   
             Unchanged on exit.   

    INCY   - INTEGER.   
             On entry, INCY specifies the increment for the elements of   
             Y. INCY must not be zero.   
             Unchanged on exit.   

    A      - COMPLEX*16       array of DIMENSION ( LDA, n ).   
             Before entry with  UPLO = 'U' or 'u', the leading n by n   
             upper triangular part of the array A must contain the upper 
  
             triangular part of the hermitian matrix and the strictly   
             lower triangular part of A is not referenced. On exit, the   
             upper triangular part of the array A is overwritten by the   
             upper triangular part of the updated matrix.   
             Before entry with UPLO = 'L' or 'l', the leading n by n   
             lower triangular part of the array A must contain the lower 
  
             triangular part of the hermitian matrix and the strictly   
             upper triangular part of A is not referenced. On exit, the   
             lower triangular part of the array A is overwritten by the   
             lower triangular part of the updated matrix.   
             Note that the imaginary parts of the diagonal elements need 
  
             not be set, they are assumed to be zero, and on exit they   
             are set to zero.   

    LDA    - INTEGER.   
             On entry, LDA specifies the first dimension of A as declared 
  
             in the calling (sub) program. LDA must be at least   
             max( 1, n ).   
             Unchanged on exit.   


    Level 2 Blas routine.   

    -- Written on 22-October-1986.   
       Jack Dongarra, Argonne National Lab.   
       Jeremy Du Croz, Nag Central Office.   
       Sven Hammarling, Nag Central Office.   
       Richard Hanson, Sandia National Labs.   



       Test the input parameters.   

    
   Parameter adjustments   
       Function Body */
#define X(I) x[(I)-1]
#define Y(I) y[(I)-1]

#define A(I,J) a[(I)-1 + ((J)-1)* ( *lda)]

    info = 0;
    if ( strncmp(uplo, "U", 1)!=0 && strncmp(uplo, "L", 1)!=0 ) {
	info = 1;
    } else if (*n < 0) {
	info = 2;
    } else if (*incx == 0) {
	info = 5;
    } else if (*incy == 0) {
	info = 7;
    } else if (*lda < max(1,*n)) {
	info = 9;
    }
    if (info != 0) {
	input_error("ZHER2 ", &info);
	return 0;
    }

/*     Quick return if possible. */

    if (*n == 0 || (alpha->r == 0. && alpha->i == 0.)) {
	return 0;
    }

/*     Set up the start points in X and Y if the increments are not both 
  
       unity. */

    if (*incx != 1 || *incy != 1) {
	if (*incx > 0) {
	    kx = 1;
	} else {
	    kx = 1 - (*n - 1) * *incx;
	}
	if (*incy > 0) {
	    ky = 1;
	} else {
	    ky = 1 - (*n - 1) * *incy;
	}
	jx = kx;
	jy = ky;
    }

/*     Start the operations. In this version the elements of A are   
       accessed sequentially with one pass through the triangular part   
       of A. */

    if (strncmp(uplo, "U", 1)==0) {

/*        Form  A  when A is stored in the upper triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L10: */
		    }
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L20: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    ix = kx;
		    iy = ky;
		    for (i = 1; i <= j-1; ++i) {
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
			ix += *incx;
			iy += *incy;
/* L30: */
		    }
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L40: */
	    }
	}
    } else {

/*        Form  A  when A is stored in the lower triangle. */

	if (*incx == 1 && *incy == 1) {
	    for (j = 1; j <= *n; ++j) {
		if (X(j).r != 0. || X(j).i != 0. || (Y(j).r != 0. || 
			Y(j).i != 0.)) {
		    d_cnjg(&z__2, &Y(j));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(j).r - alpha->i * X(j).i, 
			    z__2.i = alpha->r * X(j).i + alpha->i * X(j)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(j).r * temp1.r - X(j).i * temp1.i, 
			    z__2.i = X(j).r * temp1.i + X(j).i * 
			    temp1.r;
		    z__3.r = Y(j).r * temp2.r - Y(j).i * temp2.i, 
			    z__3.i = Y(j).r * temp2.i + Y(j).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    for (i = j + 1; i <= *n; ++i) {
			z__3.r = X(i).r * temp1.r - X(i).i * temp1.i, 
				z__3.i = X(i).r * temp1.i + X(i).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(i).r * temp2.r - Y(i).i * temp2.i, 
				z__4.i = Y(i).r * temp2.i + Y(i).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L50: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
/* L60: */
	    }
	} else {
	    for (j = 1; j <= *n; ++j) {
		if (X(jx).r != 0. || X(jx).i != 0. || (Y(jy).r != 0. || 
			Y(jy).i != 0.)) {
		    d_cnjg(&z__2, &Y(jy));
		    z__1.r = alpha->r * z__2.r - alpha->i * z__2.i, z__1.i = 
			    alpha->r * z__2.i + alpha->i * z__2.r;
		    temp1.r = z__1.r, temp1.i = z__1.i;
		    z__2.r = alpha->r * X(jx).r - alpha->i * X(jx).i, 
			    z__2.i = alpha->r * X(jx).i + alpha->i * X(jx)
			    .r;
		    d_cnjg(&z__1, &z__2);
		    temp2.r = z__1.r, temp2.i = z__1.i;
		    z__2.r = X(jx).r * temp1.r - X(jx).i * temp1.i, 
			    z__2.i = X(jx).r * temp1.i + X(jx).i * 
			    temp1.r;
		    z__3.r = Y(jy).r * temp2.r - Y(jy).i * temp2.i, 
			    z__3.i = Y(jy).r * temp2.i + Y(jy).i * 
			    temp2.r;
		    z__1.r = z__2.r + z__3.r, z__1.i = z__2.i + z__3.i;
		    d__1 = A(j,j).r + z__1.r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		    ix = jx;
		    iy = jy;
		    for (i = j + 1; i <= *n; ++i) {
			ix += *incx;
			iy += *incy;
			z__3.r = X(ix).r * temp1.r - X(ix).i * temp1.i, 
				z__3.i = X(ix).r * temp1.i + X(ix).i * 
				temp1.r;
			z__2.r = A(i,j).r + z__3.r, z__2.i = A(i,j).i + 
				z__3.i;
			z__4.r = Y(iy).r * temp2.r - Y(iy).i * temp2.i, 
				z__4.i = Y(iy).r * temp2.i + Y(iy).i * 
				temp2.r;
			z__1.r = z__2.r + z__4.r, z__1.i = z__2.i + z__4.i;
			A(i,j).r = z__1.r, A(i,j).i = z__1.i;
/* L70: */
		    }
		} else {
		    d__1 = A(j,j).r;
		    A(j,j).r = d__1, A(j,j).i = 0.;
		}
		jx += *incx;
		jy += *incy;
/* L80: */
	    }
	}
    }

    return 0;

/*     End of ZHER2 . */

}